

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O0

string * __thiscall
tinyusdz::crate::GetCrateDataTypeRepr_abi_cxx11_
          (string *__return_storage_ptr__,crate *this,CrateDataType dty)

{
  bool bVar1;
  value_type *pvVar2;
  ostream *poVar3;
  stringstream local_1e8 [8];
  stringstream ss;
  ostream aoStack_1d8 [376];
  char *local_60;
  CrateDataType ty;
  undefined1 local_48 [8];
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  CrateDataType dty_local;
  
  tyRet.contained.
  super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = this;
  GetCrateDataType_abi_cxx11_
            ((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48,(crate *)((ulong)dty.name & 0xffffffff),(int32_t)dty.name);
  bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_48);
  if (bVar1) {
    pvVar2 = nonstd::expected_lite::
             expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_48);
    local_60 = pvVar2->name;
    ty.name = *(char **)&pvVar2->dtype_id;
    ::std::__cxx11::stringstream::stringstream(local_1e8);
    poVar3 = ::std::operator<<(aoStack_1d8,"CrateDataType: ");
    poVar3 = ::std::operator<<(poVar3,local_60);
    poVar3 = ::std::operator<<(poVar3,"(");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,(uint)ty.name);
    poVar3 = ::std::operator<<(poVar3,"), supports_array = ");
    ::std::ostream::operator<<(poVar3,(bool)(ty.name._4_1_ & 1));
    ::std::__cxx11::stringstream::str();
    ty.dtype_id = CRATE_DATA_TYPE_BOOL;
    ::std::__cxx11::stringstream::~stringstream(local_1e8);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"[Invalid]",(allocator *)&ty.field_0xf);
    ::std::allocator<char>::~allocator((allocator<char> *)&ty.field_0xf);
    ty.dtype_id = CRATE_DATA_TYPE_BOOL;
  }
  nonstd::expected_lite::
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCrateDataTypeRepr(CrateDataType dty) {
  auto tyRet = GetCrateDataType(static_cast<int32_t>(dty.dtype_id));
  if (!tyRet) {
    return "[Invalid]";
  }

  const CrateDataType ty = tyRet.value();

  std::stringstream ss;
  ss << "CrateDataType: " << ty.name << "("
     << static_cast<uint32_t>(ty.dtype_id)
     << "), supports_array = " << ty.supports_array;
  return ss.str();
}